

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O1

void Extra_TruthCofactor0(uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  int iVar7;
  ulong uVar8;
  
  uVar1 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar1 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilTruth.c"
                  ,0x1c7,"void Extra_TruthCofactor0(unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0x55555555) * 3;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 1:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0x33333333) * 5;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 2:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0xf0f0f0f) << 4 | pTruth[uVar3] & 0xf0f0f0f;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 3:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = (pTruth[uVar3] & 0xff00ff) << 8 | pTruth[uVar3] & 0xff00ff;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  case 4:
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        pTruth[uVar3] = CONCAT22((short)pTruth[uVar3],(short)pTruth[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    break;
  default:
    if (0 < (int)uVar1) {
      bVar2 = (byte)(iVar + -5);
      uVar5 = 1 << (bVar2 & 0x1f);
      iVar4 = 2 << (bVar2 & 0x1f);
      uVar3 = 1;
      if (1 < (int)uVar5) {
        uVar3 = (ulong)uVar5;
      }
      puVar6 = pTruth + (int)uVar5;
      iVar7 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar8 = 0;
          do {
            puVar6[uVar8] = pTruth[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar3 != uVar8);
        }
        iVar7 = iVar7 + iVar4;
        puVar6 = puVar6 + iVar4;
        pTruth = pTruth + iVar4;
      } while (iVar7 < (int)uVar1);
    }
  }
  return;
}

Assistant:

void Extra_TruthCofactor0( unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Extra_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x55555555) | ((pTruth[i] & 0x55555555) << 1);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x33333333) | ((pTruth[i] & 0x33333333) << 2);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x0F0F0F0F) | ((pTruth[i] & 0x0F0F0F0F) << 4);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x00FF00FF) | ((pTruth[i] & 0x00FF00FF) << 8);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = (pTruth[i] & 0x0000FFFF) | ((pTruth[i] & 0x0000FFFF) << 16);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
                pTruth[Step+i] = pTruth[i];
            pTruth += 2*Step;
        }
        return;
    }
}